

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void PerfomanceTester<unsigned_short,_void>::Test(void)

{
  NoAction<unsigned_short>();
  Int2StrConvert<unsigned_short>();
  BoostLexicalCastOnStack<unsigned_short>();
  SpiritKarma<unsigned_short>();
  StdSprintf<unsigned_short>();
  StdStringStreamWithRewind<unsigned_short>();
  return;
}

Assistant:

static void Test()
    {
        NoAction<T>();
        Int2StrConvert<T>();
#ifdef USE_BOOST
        BoostLexicalCastOnStack<T>();
        SpiritKarma<T>();
#endif
        StdSprintf<T>();
        StdStringStreamWithRewind<T>();
    }